

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

size_t __thiscall
std::hash<om::net::ip4_flow_key>::operator()(hash<om::net::ip4_flow_key> *this,ip4_flow_key *d_)

{
  byte bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  ip4_addr local_30;
  ip4_addr local_2c;
  ulong local_28;
  uint64_t b;
  uint64_t a;
  ip4_flow_key *d__local;
  hash<om::net::ip4_flow_key> *this_local;
  
  b = 0;
  local_28 = 0;
  a = (uint64_t)d_;
  d__local = (ip4_flow_key *)this;
  local_2c = om::net::ip4_flow_key::ip_src(d_);
  uVar3 = om::net::ip4_addr::to_uint32(&local_2c);
  b = b | (ulong)uVar3 << 0x20;
  local_30 = om::net::ip4_flow_key::ip_dst((ip4_flow_key *)a);
  uVar3 = om::net::ip4_addr::to_uint32(&local_30);
  b = uVar3 | b;
  uVar2 = om::net::ip4_flow_key::tp_src((ip4_flow_key *)a);
  local_28 = (ulong)uVar2 << 0x18 | local_28;
  uVar2 = om::net::ip4_flow_key::tp_dst((ip4_flow_key *)a);
  local_28 = (ulong)uVar2 << 8 | local_28;
  bVar1 = om::net::ip4_flow_key::ip_proto((ip4_flow_key *)a);
  return b ^ (bVar1 | local_28) + 0x9e3779b9 + b * 0x40 + ((bVar1 | local_28) >> 2);
}

Assistant:

inline std::size_t operator()(const om::net::ip4_flow_key& d_) const noexcept
		{
			// pack into two different long unsigned integers
			uint64_t a = 0, b = 0;
			a |= (uint64_t) d_.ip_src().to_uint32() << 32;
			a |= (uint64_t) d_.ip_dst().to_uint32() <<  0;
			b |= (uint64_t) d_.tp_src()             << 24;
			b |= (uint64_t) d_.tp_dst()             <<  8;
			b |= (uint64_t) d_.ip_proto()           <<  0;
			return ((size_t) a xor ((size_t) b + 0x9e3779b9 + (a << 6) + (b >> 2)));
		}